

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_struct_print_method(t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_cpp_generator *ptVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  t_cpp_generator *this_00;
  undefined1 local_48 [32];
  
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_48._0_8_,local_48._8_8_);
  ptVar2 = (t_cpp_generator *)(local_48 + 0x10);
  this_00 = (t_cpp_generator *)local_48._0_8_;
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  generate_struct_print_method_decl(this_00,out,tstruct);
  std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"using ::apache::thrift::to_string;",0x22);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"out << \"",8);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(\";",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  struct_ostream_operator_generator::generate_fields(out,&tstruct->members_,(string *)local_48);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"out << \")\";",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_struct_print_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_struct_print_method_decl(out, tstruct);
  out << " {" << endl;

  indent_up();

  out << indent() << "using ::apache::thrift::to_string;" << endl;
  out << indent() << "out << \"" << tstruct->get_name() << "(\";" << endl;
  struct_ostream_operator_generator::generate_fields(out, tstruct->get_members(), indent());
  out << indent() << "out << \")\";" << endl;

  indent_down();
  out << "}" << endl << endl;
}